

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O2

void __thiscall QScrollBar::mouseMoveEvent(QScrollBar *this,QMouseEvent *e)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  QScrollBarPrivate *this_00;
  Representation RVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  SubControl control;
  QStyle *pQVar9;
  QPoint QVar10;
  long lVar11;
  undefined8 *puVar12;
  QStyleOptionSlider *pQVar13;
  long in_FS_OFFSET;
  QRect QVar14;
  QRect local_e0;
  QPoint local_d0;
  QRect local_c8;
  QStyleOptionSlider opt;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if (this_00->pressedControl == SC_None) goto LAB_0043a779;
  puVar12 = &DAT_00661ce0;
  pQVar13 = &opt;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    uVar1 = *puVar12;
    (pQVar13->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar13->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar12 = puVar12 + 1;
    pQVar13 = (QStyleOptionSlider *)&(pQVar13->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&opt);
  if ((*(uint *)(e + 0x44) & 1) == 0) {
    if ((*(uint *)(e + 0x44) & 4) != 0) {
      pQVar9 = QWidget::style((QWidget *)this);
      iVar7 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,2,&opt,this,0);
      if (iVar7 != 0) goto LAB_0043a657;
    }
  }
  else {
LAB_0043a657:
    if (this_00->pressedControl == SC_ScrollBarSlider) {
      local_c8 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)e);
      QVar10 = QPointF::toPoint((QPointF *)&local_c8);
      RVar4 = QVar10.yp.m_i;
      if (*(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280) == 1) {
        RVar4 = QVar10.xp.m_i;
      }
      iVar7 = QScrollBarPrivate::pixelPosToRangeValue(this_00,RVar4.m_i - this_00->clickOffset);
      pQVar9 = QWidget::style((QWidget *)this);
      iVar8 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,8,&opt,this);
      if (-1 < iVar8) {
        QVar14 = QWidget::rect((QWidget *)this);
        local_c8.y1.m_i = QVar14.y1.m_i.m_i - iVar8;
        local_c8.x1.m_i = QVar14.x1.m_i.m_i - iVar8;
        local_c8.x2.m_i = QVar14.x2.m_i.m_i + iVar8;
        local_c8.y2.m_i = QVar14.y2.m_i.m_i + iVar8;
        local_e0 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)e);
        local_d0 = QPointF::toPoint((QPointF *)&local_e0);
        cVar5 = QRect::contains((QPoint *)&local_c8,SUB81(&local_d0,0));
        if (cVar5 == '\0') {
          iVar7 = this_00->snapBackPosition;
        }
      }
      QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,iVar7);
    }
    else {
      pQVar9 = QWidget::style((QWidget *)this);
      iVar7 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,3,&opt,this,0);
      if (iVar7 == 0) {
        pQVar9 = QWidget::style((QWidget *)this);
        iVar7 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x3f,&opt,this,0);
        if ((iVar7 == 0) ||
           ((this_00->pressedControl & (SC_ComboBoxEditField|SC_ComboBoxFrame)) == SC_None)) {
LAB_0043a8dd:
          pQVar9 = QWidget::style((QWidget *)this);
          local_c8 = (QRect)(**(code **)(*(long *)pQVar9 + 0xd8))
                                      (pQVar9,2,&opt,this_00->pressedControl,this);
          local_e0 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)e);
          local_d0 = QPointF::toPoint((QPointF *)&local_e0);
          bVar6 = QRect::contains((QPoint *)&local_c8,SUB81(&local_d0,0));
          bVar2 = this_00->pointerOutsidePressedControl;
          if (bVar2 == (bool)bVar6) {
            this_00->pointerOutsidePressedControl = (bool)(bVar2 ^ 1);
            if (bVar2 == false) {
              this_00->pointerOutsidePressedControl = true;
              QAbstractSlider::setRepeatAction(&this->super_QAbstractSlider,SliderNoAction,500,0x32)
              ;
              QWidget::repaint((QWidget *)this,&local_c8);
            }
            else {
              QScrollBarPrivate::activateControl(this_00,this_00->pressedControl,500);
            }
          }
        }
        else {
          pQVar9 = QWidget::style((QWidget *)this);
          local_c8 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)e);
          QVar10 = QPointF::toPoint((QPointF *)&local_c8);
          local_e0.x1.m_i = QVar10.xp.m_i;
          local_e0.y1.m_i = QVar10.yp.m_i;
          control = (**(code **)(*(long *)pQVar9 + 0xd0))(pQVar9,2,&opt,&local_e0,this);
          if ((control != this_00->pressedControl) ||
             (this_00->pointerOutsidePressedControl == true)) {
            if ((control & (SC_ComboBoxEditField|SC_ComboBoxFrame)) == SC_None) goto LAB_0043a8dd;
            this_00->pointerOutsidePressedControl = false;
            pQVar9 = QWidget::style((QWidget *)this);
            local_c8 = (QRect)(**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,2,&opt,control,this);
            pQVar9 = QWidget::style((QWidget *)this);
            local_e0 = (QRect)(**(code **)(*(long *)pQVar9 + 0xd8))
                                        (pQVar9,2,&opt,this_00->pressedControl,this);
            QRect::operator|=(&local_c8,&local_e0);
            this_00->pressedControl = control;
            QScrollBarPrivate::activateControl(this_00,control,0);
            QWidget::update((QWidget *)this,&local_c8);
          }
        }
      }
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
LAB_0043a779:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);
    if (!d->pressedControl)
        return;

    QStyleOptionSlider opt;
    initStyleOption(&opt);
    if (!(e->buttons() & Qt::LeftButton
          ||  ((e->buttons() & Qt::MiddleButton)
               && style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition, &opt, this))))
        return;

    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        QPoint click = e->position().toPoint();
        int newPosition = d->pixelPosToRangeValue((HORIZONTAL ? click.x() : click.y()) -d->clickOffset);
        int m = style()->pixelMetric(QStyle::PM_MaximumDragDistance, &opt, this);
        if (m >= 0) {
            QRect r = rect();
            r.adjust(-m, -m, m, m);
            if (! r.contains(e->position().toPoint()))
                newPosition = d->snapBackPosition;
        }
        setSliderPosition(newPosition);
    } else if (!style()->styleHint(QStyle::SH_ScrollBar_ScrollWhenPointerLeavesControl, &opt, this)) {

        if (style()->styleHint(QStyle::SH_ScrollBar_RollBetweenButtons, &opt, this)
                && d->pressedControl & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
            QStyle::SubControl newSc = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
            if (newSc == d->pressedControl && !d->pointerOutsidePressedControl)
                return; // nothing to do
            if (newSc & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
                d->pointerOutsidePressedControl = false;
                QRect scRect = style()->subControlRect(QStyle::CC_ScrollBar, &opt, newSc, this);
                scRect |= style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
                d->pressedControl = newSc;
                d->activateControl(d->pressedControl, 0);
                update(scRect);
                return;
            }
        }

        // stop scrolling when the mouse pointer leaves a control
        // similar to push buttons
        QRect pr = style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
        if (pr.contains(e->position().toPoint()) == d->pointerOutsidePressedControl) {
            if ((d->pointerOutsidePressedControl = !d->pointerOutsidePressedControl)) {
                d->pointerOutsidePressedControl = true;
                setRepeatAction(SliderNoAction);
                repaint(pr);
            } else  {
                d->activateControl(d->pressedControl);
            }
        }
    }
}